

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng_ext.c
# Opt level: O2

void light_pcapng_close(light_pcapng_t *pcapng)

{
  void *x_ret;
  
  if (pcapng != (light_pcapng_t *)0x0) {
    light_pcapng_release(pcapng->pcapng);
    if (pcapng->file != (__fd_t)0x0) {
      light_flush(pcapng->file);
      light_close(pcapng->file);
    }
    light_free_file_info(pcapng->file_info);
    free(pcapng);
    return;
  }
  fprintf(_stderr,"NULL pointer ERROR at %s::%s::%d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng_ext.c"
          ,"light_pcapng_close",0x207);
  return;
}

Assistant:

void light_pcapng_close(light_pcapng_t *pcapng)
{
	DCHECK_NULLP(pcapng, return);
	light_pcapng_release(pcapng->pcapng);
	if (pcapng->file != NULL)
	{
		light_flush(pcapng->file);
		light_close(pcapng->file);
	}
	light_free_file_info(pcapng->file_info);
	free(pcapng);
}